

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void __thiscall
cfd::core::TaprootScriptTree::AddBranch(TaprootScriptTree *this,TaprootScriptTree *tree)

{
  ByteData256 local_30;
  
  TapBranch::AddBranch(&this->super_TapBranch,&tree->super_TapBranch);
  TapBranch::GetBranchHash
            (&local_30,&tree->super_TapBranch,
             (char)((uint)(*(int *)&(tree->super_TapBranch).branch_list_.
                                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(tree->super_TapBranch).branch_list_.
                                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&this->nodes_,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TaprootScriptTree::AddBranch(const TaprootScriptTree& tree) {
  TapBranch::AddBranch(tree);
  nodes_.emplace_back(tree.GetCurrentBranchHash());
}